

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persp_lh_zo.c
# Opt level: O3

void glmc_persp_sizes_lh_zo(vec4 *proj,float fovy,float *dest)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  float fVar4;
  
  fVar1 = tanf(fovy * 0.5);
  auVar2._4_4_ = proj[1][1];
  auVar2._0_4_ = proj[3][2];
  auVar2._8_8_ = 0;
  auVar3._8_4_ = 0x80000000;
  auVar3._0_8_ = CONCAT44((*proj)[0],proj[2][2]) ^ 0x80000000;
  auVar3._12_4_ = 0;
  auVar3 = divps(auVar2,auVar3);
  fVar4 = (proj[3][2] / (1.0 - proj[2][2])) * (fVar1 + fVar1);
  dest[3] = fVar4;
  fVar1 = (fVar1 + fVar1) * auVar3._0_4_;
  *dest = auVar3._4_4_ * fVar1;
  *(ulong *)(dest + 1) = CONCAT44(fVar4 * auVar3._4_4_,fVar1);
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_persp_sizes_lh_zo(mat4 proj, float fovy, vec4 dest) {
  glm_persp_sizes_lh_zo(proj, fovy, dest);
}